

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

int Ver_ParseInsertsSuffix(Ver_Man_t *pMan,char *pWord,int nMsb,int nLsb)

{
  int iVar1;
  st__table *psVar2;
  char *key;
  
  if (pMan->tName2Suffix == (st__table *)0x0) {
    psVar2 = st__init_table(strcmp,st__strhash);
    pMan->tName2Suffix = psVar2;
  }
  iVar1 = st__lookup(pMan->tName2Suffix,pWord,(char **)0x0);
  if (iVar1 == 0) {
    if (0x7f < (uint)nMsb) {
      __assert_fail("nMsb >= 0 && nMsb < 128",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                    ,0x252,"int Ver_ParseInsertsSuffix(Ver_Man_t *, char *, int, int)");
    }
    if (0x7f < (uint)nLsb) {
      __assert_fail("nLsb >= 0 && nLsb < 128",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                    ,0x253,"int Ver_ParseInsertsSuffix(Ver_Man_t *, char *, int, int)");
    }
    psVar2 = pMan->tName2Suffix;
    key = Extra_UtilStrsav(pWord);
    st__insert(psVar2,key,(char *)(ulong)(uint)(nMsb << 8 | nLsb));
  }
  return 1;
}

Assistant:

int Ver_ParseInsertsSuffix( Ver_Man_t * pMan, char * pWord, int nMsb, int nLsb )
{
    unsigned Value;
    if ( pMan->tName2Suffix == NULL )
        pMan->tName2Suffix = st__init_table( strcmp, st__strhash );
    if ( st__is_member( pMan->tName2Suffix, pWord ) )
        return 1;
    assert( nMsb >= 0 && nMsb < 128 );
    assert( nLsb >= 0 && nLsb < 128 );
    Value = (nMsb << 8) | nLsb;
    st__insert( pMan->tName2Suffix, Extra_UtilStrsav(pWord), (char *)(ABC_PTRUINT_T)Value );
    return 1;
}